

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O1

void throwOnWrongMessage(StatsdServer *server,string *expected)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this;
  string actual;
  string local_30;
  
  Statsd::StatsdServer::receive_abi_cxx11_(&local_30,server);
  if (local_30._M_string_length == expected->_M_string_length) {
    if (local_30._M_string_length != 0) {
      iVar1 = bcmp(local_30._M_dataplus._M_p,(expected->_M_dataplus)._M_p,local_30._M_string_length)
      ;
      if (iVar1 != 0) goto LAB_001038a5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    return;
  }
LAB_001038a5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected: ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(expected->_M_dataplus)._M_p,expected->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," but got: ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Incorrect stat received");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwOnWrongMessage(StatsdServer& server, const std::string& expected) {
    auto actual = server.receive();
    if (actual != expected) {
        std::cerr << "Expected: " << expected << " but got: " << actual << std::endl;
        throw std::runtime_error("Incorrect stat received");
    }
}